

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O3

QEasingCurveFunction * curveToFunctionObject(Type type)

{
  BezierEase *pBVar1;
  undefined **ppuVar2;
  QEasingCurveFunction *pQVar3;
  
  switch(type) {
  case InElastic:
  case OutElastic:
  case InOutElastic:
  case OutInElastic:
    pBVar1 = (BezierEase *)operator_new(0x58);
    (pBVar1->super_QEasingCurveFunction)._t = type;
    (pBVar1->super_QEasingCurveFunction)._p = 0.3;
    (pBVar1->super_QEasingCurveFunction)._a = 1.0;
    (pBVar1->super_QEasingCurveFunction)._o = 1.70158;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.ptr = (QPointF *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.size = 0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.ptr = (TCBPoint *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.size = 0;
    ppuVar2 = &PTR__QEasingCurveFunction_0069ece8;
    break;
  case InBack:
  case OutBack:
  case InOutBack:
  case OutInBack:
    pBVar1 = (BezierEase *)operator_new(0x58);
    (pBVar1->super_QEasingCurveFunction)._t = type;
    (pBVar1->super_QEasingCurveFunction)._p = 0.3;
    (pBVar1->super_QEasingCurveFunction)._a = 1.0;
    (pBVar1->super_QEasingCurveFunction)._o = 1.70158;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.ptr = (QPointF *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.size = 0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.ptr = (TCBPoint *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.size = 0;
    ppuVar2 = &PTR__QEasingCurveFunction_0069ed78;
    break;
  case InBounce:
  case OutBounce:
  case InOutBounce:
  case OutInBounce:
    pBVar1 = (BezierEase *)operator_new(0x58);
    (pBVar1->super_QEasingCurveFunction)._t = type;
    (pBVar1->super_QEasingCurveFunction)._p = 0.3;
    (pBVar1->super_QEasingCurveFunction)._a = 1.0;
    (pBVar1->super_QEasingCurveFunction)._o = 1.70158;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.ptr = (QPointF *)0x0;
    (pBVar1->super_QEasingCurveFunction)._bezierCurves.d.size = 0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.d = (Data *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.ptr = (TCBPoint *)0x0;
    (pBVar1->super_QEasingCurveFunction)._tcbPoints.d.size = 0;
    ppuVar2 = &PTR__QEasingCurveFunction_0069ed30;
    break;
  default:
    pQVar3 = (QEasingCurveFunction *)operator_new(0x58);
    pQVar3->_vptr_QEasingCurveFunction = (_func_int **)&PTR__QEasingCurveFunction_0069eb40;
    pQVar3->_t = type;
    pQVar3->_p = 0.3;
    pQVar3->_a = 1.0;
    pQVar3->_o = 1.70158;
    (pQVar3->_bezierCurves).d.d = 0;
    *(QPointF **)((long)&(pQVar3->_bezierCurves).d + 8) = (QPointF *)0x0;
    *(qsizetype *)((long)&(pQVar3->_bezierCurves).d + 0x10) = 0;
    (pQVar3->_tcbPoints).d.d = 0;
    *(TCBPoint **)((long)&(pQVar3->_tcbPoints).d + 8) = (TCBPoint *)0x0;
    *(qsizetype *)((long)&(pQVar3->_tcbPoints).d + 0x10) = 0;
    return pQVar3;
  case BezierSpline:
    pBVar1 = (BezierEase *)operator_new(0x90);
    BezierEase::BezierEase(pBVar1,BezierSpline);
    return &pBVar1->super_QEasingCurveFunction;
  case TCBSpline:
    pBVar1 = (BezierEase *)operator_new(0x90);
    BezierEase::BezierEase(pBVar1,TCBSpline);
    ppuVar2 = &PTR__BezierEase_0069ee08;
  }
  (pBVar1->super_QEasingCurveFunction)._vptr_QEasingCurveFunction = (_func_int **)ppuVar2;
  return &pBVar1->super_QEasingCurveFunction;
}

Assistant:

static QEasingCurveFunction *curveToFunctionObject(QEasingCurve::Type type)
{
    switch (type) {
    case QEasingCurve::InElastic:
    case QEasingCurve::OutElastic:
    case QEasingCurve::InOutElastic:
    case QEasingCurve::OutInElastic:
        return new ElasticEase(type);
    case QEasingCurve::OutBounce:
    case QEasingCurve::InBounce:
    case QEasingCurve::OutInBounce:
    case QEasingCurve::InOutBounce:
        return new BounceEase(type);
    case QEasingCurve::InBack:
    case QEasingCurve::OutBack:
    case QEasingCurve::InOutBack:
    case QEasingCurve::OutInBack:
        return new BackEase(type);
    case QEasingCurve::BezierSpline:
        return new BezierEase;
    case QEasingCurve::TCBSpline:
        return new TCBEase;
    default:
        return new QEasingCurveFunction(type, qreal(0.3), qreal(1.0), qreal(1.70158));
    }

    return nullptr;
}